

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeArrayInitElem
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType type,Name elem)

{
  Name seg;
  Name name;
  bool bVar1;
  ElementSegment *pEVar2;
  ArrayInitElem *pAVar3;
  optional<wasm::HeapType> ht;
  Ok local_1d9;
  IRBuilder *local_1d8;
  size_t local_1d0;
  Err local_1c8;
  Err *local_1a8;
  Err *err_1;
  undefined1 local_198 [8];
  Result<wasm::Ok> _val_1;
  Err local_168;
  Err *local_148;
  Err *err;
  undefined1 local_138;
  undefined3 uStack_137;
  ChildPopper local_130;
  undefined1 local_128 [8];
  Result<wasm::Ok> _val;
  ArrayInitElem curr;
  Err local_b8;
  Type local_98 [2];
  uintptr_t local_88;
  IRBuilder *local_80;
  size_t local_78;
  Type local_70;
  allocator<char> local_51;
  Err local_50;
  IRBuilder *local_30;
  IRBuilder *this_local;
  Name elem_local;
  HeapType type_local;
  
  elem_local.super_IString.str._M_len = elem.super_IString.str._M_str;
  this_local = elem.super_IString.str._M_len;
  local_30 = this;
  elem_local.super_IString.str._M_str = (char *)type.id;
  bVar1 = HeapType::isArray((HeapType *)&elem_local.super_IString.str._M_str);
  if (bVar1) {
    local_80 = this_local;
    local_78 = elem_local.super_IString.str._M_len;
    name.super_IString.str._M_str = (char *)elem_local.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)this_local;
    pEVar2 = Module::getElementSegment(this->wasm,name);
    local_70.id = (pEVar2->type).id;
    HeapType::getArray((HeapType *)local_98);
    local_88 = local_98[0].id;
    bVar1 = wasm::Type::isSubType(local_70,local_98[0]);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pAVar3 = (ArrayInitElem *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
      ArrayInitElem::ArrayInitElem(pAVar3);
      ChildPopper::ChildPopper(&local_130,this);
      std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
                ((optional<wasm::HeapType> *)&err,(HeapType *)&elem_local.super_IString.str._M_str);
      ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
      ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)err;
      ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_138;
      ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_3_ = uStack_137;
      ChildPopper::visitArrayInitElem((Result<wasm::Ok> *)local_128,&local_130,pAVar3,ht);
      local_148 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_128);
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = local_148 != (Err *)0x0;
      if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
        wasm::Err::Err(&local_168,local_148);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_168);
        wasm::Err::~Err(&local_168);
      }
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_128);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
        err_1 = (Err *)elem_local.super_IString.str._M_str;
        anon_unknown_282::validateTypeAnnotation
                  ((Result<wasm::Ok> *)local_198,(HeapType)elem_local.super_IString.str._M_str,
                   (Expression *)curr.segment.super_IString.str._M_str);
        local_1a8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_198);
        bVar1 = local_1a8 != (Err *)0x0;
        if (bVar1) {
          wasm::Err::Err(&local_1c8,local_1a8);
          Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1c8);
          wasm::Err::~Err(&local_1c8);
        }
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar1;
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_198);
        if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
          local_1d8 = this_local;
          local_1d0 = elem_local.super_IString.str._M_len;
          seg.super_IString.str._M_str = (char *)elem_local.super_IString.str._M_len;
          seg.super_IString.str._M_len = (size_t)this_local;
          pAVar3 = Builder::makeArrayInitElem
                             (&this->builder,seg,(Expression *)curr.segment.super_IString.str._M_str
                              ,curr.ref,curr.index,curr.offset);
          push(this,(Expression *)pAVar3);
          Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1d9);
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "element segment type must be a subtype of array element type on array.init_elem",
                 (allocator<char> *)((long)&curr.size + 7));
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
      wasm::Err::~Err(&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&curr.size + 7));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"expected array type annotation on array.init_elem",&local_51);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_50);
    wasm::Err::~Err(&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeArrayInitElem(HeapType type, Name elem) {
  // Validate the elem type, too, before we potentially forget the type
  // annotation.
  if (!type.isArray()) {
    return Err{"expected array type annotation on array.init_elem"};
  }
  if (!Type::isSubType(wasm.getElementSegment(elem)->type,
                       type.getArray().element.type)) {
    return Err{"element segment type must be a subtype of array element type "
               "on array.init_elem"};
  }
  ArrayInitElem curr;
  CHECK_ERR(ChildPopper{*this}.visitArrayInitElem(&curr, type));
  CHECK_ERR(validateTypeAnnotation(type, curr.ref));
  push(builder.makeArrayInitElem(
    elem, curr.ref, curr.index, curr.offset, curr.size));
  return Ok{};
}